

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,NamedVar *var)

{
  ostream *poVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  poVar1 = std::operator<<(os,"Name:");
  poVar1 = std::operator<<(poVar1,(string *)&var->name_);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(os,"Values:");
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(var->super_Variable).values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(var->super_Variable).values_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(os," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"=");
    std::operator<<(poVar1,(string *)
                           ((long)&(((var->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar2));
    lVar2 = lVar2 + 0x20;
  }
  return os;
}

Assistant:

ostream& operator<<(std::ostream& os, const NamedVar& var) {
	os << "Name:" << var.name_ << endl;
	os << "Values:";

	for (int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	return os;
}